

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu.c
# Opt level: O0

size_t read_metadata(AV1Decoder *pbi,uint8_t *data,size_t sz,_Bool has_obu_extension_header)

{
  uint8_t uVar1;
  int iVar2;
  size_t sVar3;
  byte in_CL;
  size_t in_RDX;
  uint8_t *in_RSI;
  AV1Decoder *in_RDI;
  aom_read_bit_buffer rb;
  size_t bytes_read_1;
  size_t bytes_read;
  OBU_METADATA_TYPE metadata_type;
  uint64_t type_value;
  size_t type_length;
  undefined8 in_stack_ffffffffffffff78;
  aom_read_bit_buffer *in_stack_ffffffffffffff80;
  AV1Decoder *in_stack_ffffffffffffff88;
  AV1Decoder *in_stack_ffffffffffffff90;
  uint local_68;
  uint local_38 [2];
  size_t local_30;
  byte local_21;
  size_t local_20;
  uint8_t *local_18;
  AV1Decoder *local_10;
  size_t local_8;
  
  local_21 = in_CL & 1;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar2 = aom_uleb_decode(in_RSI,in_RDX,(uint64_t *)local_38,&local_30);
  if (iVar2 < 0) {
    (local_10->error).error_code = AOM_CODEC_CORRUPT_FRAME;
    local_8 = 0;
  }
  else if ((local_38[0] == 0) || (5 < local_38[0])) {
    uVar1 = get_last_nonzero_byte(local_18 + local_30,local_20 - local_30);
    if (uVar1 == '\0') {
      (local_10->error).error_code = AOM_CODEC_CORRUPT_FRAME;
      local_8 = 0;
    }
    else {
      local_8 = local_20;
    }
  }
  else if (local_38[0] == 4) {
    read_metadata_itut_t35
              (in_stack_ffffffffffffff90,(uint8_t *)in_stack_ffffffffffffff88,
               (size_t)in_stack_ffffffffffffff80,SUB81((ulong)in_stack_ffffffffffffff78 >> 0x38,0));
    local_8 = local_20;
  }
  else if (local_38[0] == 1) {
    sVar3 = read_metadata_hdr_cll
                      (in_stack_ffffffffffffff90,(uint8_t *)in_stack_ffffffffffffff88,local_30);
    uVar1 = get_last_nonzero_byte(local_18 + local_30 + sVar3,local_20 - (local_30 + sVar3));
    if (uVar1 == 0x80) {
      local_8 = local_20;
    }
    else {
      (local_10->error).error_code = AOM_CODEC_CORRUPT_FRAME;
      local_8 = 0;
    }
  }
  else if (local_38[0] == 2) {
    sVar3 = read_metadata_hdr_mdcv
                      (in_stack_ffffffffffffff90,(uint8_t *)in_stack_ffffffffffffff88,
                       (size_t)in_stack_ffffffffffffff80);
    uVar1 = get_last_nonzero_byte(local_18 + local_30 + sVar3,local_20 - (local_30 + sVar3));
    if (uVar1 == 0x80) {
      local_8 = local_20;
    }
    else {
      (local_10->error).error_code = AOM_CODEC_CORRUPT_FRAME;
      local_8 = 0;
    }
  }
  else {
    av1_init_read_bit_buffer
              (local_10,(aom_read_bit_buffer *)&stack0xffffffffffffff88,local_18 + local_30,
               local_18 + local_20);
    if (local_38[0] == 3) {
      read_metadata_scalability(in_stack_ffffffffffffff80);
    }
    else {
      read_metadata_timecode((aom_read_bit_buffer *)in_stack_ffffffffffffff90);
    }
    iVar2 = av1_check_trailing_bits(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    if (iVar2 == 0) {
      local_8 = local_30 + (local_68 >> 3);
    }
    else {
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

static size_t read_metadata(AV1Decoder *pbi, const uint8_t *data, size_t sz,
                            bool has_obu_extension_header) {
  size_t type_length;
  uint64_t type_value;
  if (aom_uleb_decode(data, sz, &type_value, &type_length) < 0) {
    pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
    return 0;
  }
  const OBU_METADATA_TYPE metadata_type = (OBU_METADATA_TYPE)type_value;
  if (metadata_type == 0 || metadata_type >= 6) {
    // If metadata_type is reserved for future use or a user private value,
    // ignore the entire OBU and just check trailing bits.
    if (get_last_nonzero_byte(data + type_length, sz - type_length) == 0) {
      pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
      return 0;
    }
    return sz;
  }
  if (metadata_type == OBU_METADATA_TYPE_ITUT_T35) {
    // read_metadata_itut_t35() checks trailing bits.
    read_metadata_itut_t35(pbi, data + type_length, sz - type_length,
                           has_obu_extension_header);
    return sz;
  } else if (metadata_type == OBU_METADATA_TYPE_HDR_CLL) {
    size_t bytes_read =
        type_length +
        read_metadata_hdr_cll(pbi, data + type_length, sz - type_length);
    if (get_last_nonzero_byte(data + bytes_read, sz - bytes_read) != 0x80) {
      pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
      return 0;
    }
    return sz;
  } else if (metadata_type == OBU_METADATA_TYPE_HDR_MDCV) {
    size_t bytes_read =
        type_length +
        read_metadata_hdr_mdcv(pbi, data + type_length, sz - type_length);
    if (get_last_nonzero_byte(data + bytes_read, sz - bytes_read) != 0x80) {
      pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
      return 0;
    }
    return sz;
  }

  struct aom_read_bit_buffer rb;
  av1_init_read_bit_buffer(pbi, &rb, data + type_length, data + sz);
  if (metadata_type == OBU_METADATA_TYPE_SCALABILITY) {
    read_metadata_scalability(&rb);
  } else {
    assert(metadata_type == OBU_METADATA_TYPE_TIMECODE);
    read_metadata_timecode(&rb);
  }
  if (av1_check_trailing_bits(pbi, &rb) != 0) {
    // pbi->error.error_code is already set.
    return 0;
  }
  assert((rb.bit_offset & 7) == 0);
  return type_length + (rb.bit_offset >> 3);
}